

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void ImPlot::RenderLineStrip<ImPlot::GetterXsYs<long_long>,ImPlot::TransformerLogLog>
               (GetterXsYs<long_long> *getter,TransformerLogLog *transformer,ImDrawList *DrawList,
               float line_weight,ImU32 col)

{
  float *pfVar1;
  float fVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  ImPlotPlot *pIVar7;
  long lVar8;
  double dVar9;
  double dVar10;
  ImPlotContext *pIVar11;
  ImPlotContext *pIVar12;
  long lVar13;
  int iVar14;
  int iVar15;
  ImPlotContext *gp;
  float fVar16;
  ImVec2 p2;
  ImVec2 p1;
  ImVec2 local_68;
  ImDrawList *local_60;
  undefined1 local_58 [8];
  TransformerLogLog *local_50;
  int local_48;
  ImU32 local_44;
  float local_40;
  ImVec2 local_3c;
  
  pIVar11 = GImPlot;
  pIVar7 = GImPlot->CurrentPlot;
  local_60 = DrawList;
  if (((pIVar7->Flags & 0x1000) == 0) && ((GImPlot->Style).AntiAliasedLines != true)) {
    iVar14 = getter->Count;
    local_48 = iVar14 + -1;
    local_3c.x = 0.0;
    local_3c.y = 0.0;
    lVar13 = (long)((getter->Offset % iVar14 + iVar14) % iVar14) * (long)getter->Stride;
    lVar8 = *(long *)((long)getter->Ys + lVar13);
    local_58 = (undefined1  [8])getter;
    local_50 = transformer;
    local_44 = col;
    local_40 = line_weight;
    dVar9 = log10((double)*(long *)((long)getter->Xs + lVar13) / (pIVar7->XAxis).Range.Min);
    dVar3 = pIVar11->LogDenX;
    pIVar7 = pIVar11->CurrentPlot;
    dVar4 = (pIVar7->XAxis).Range.Min;
    dVar5 = (pIVar7->XAxis).Range.Max;
    dVar10 = log10((double)lVar8 / pIVar7->YAxis[transformer->YAxis].Range.Min);
    iVar14 = transformer->YAxis;
    pIVar7 = pIVar11->CurrentPlot;
    dVar6 = pIVar7->YAxis[iVar14].Range.Min;
    local_3c.x = (float)((((double)(float)(dVar9 / dVar3) * (dVar5 - dVar4) + dVar4) -
                         (pIVar7->XAxis).Range.Min) * pIVar11->Mx +
                        (double)pIVar11->PixelRange[iVar14].Min.x);
    local_3c.y = (float)((((double)(float)(dVar10 / pIVar11->LogDenY[iVar14]) *
                           (pIVar7->YAxis[iVar14].Range.Max - dVar6) + dVar6) - dVar6) *
                         pIVar11->My[iVar14] + (double)pIVar11->PixelRange[iVar14].Min.y);
    RenderPrimitives<ImPlot::LineStripRenderer<ImPlot::GetterXsYs<long_long>,ImPlot::TransformerLogLog>>
              ((LineStripRenderer<ImPlot::GetterXsYs<long_long>,_ImPlot::TransformerLogLog> *)
               local_58,local_60,&pIVar7->PlotRect);
  }
  else {
    iVar14 = getter->Count;
    lVar13 = (long)((getter->Offset % iVar14 + iVar14) % iVar14) * (long)getter->Stride;
    lVar8 = *(long *)((long)getter->Ys + lVar13);
    dVar9 = log10((double)*(long *)((long)getter->Xs + lVar13) / (pIVar7->XAxis).Range.Min);
    dVar3 = pIVar11->LogDenX;
    pIVar7 = pIVar11->CurrentPlot;
    dVar4 = (pIVar7->XAxis).Range.Min;
    dVar5 = (pIVar7->XAxis).Range.Max;
    dVar10 = log10((double)lVar8 / pIVar7->YAxis[transformer->YAxis].Range.Min);
    iVar14 = transformer->YAxis;
    pIVar7 = pIVar11->CurrentPlot;
    dVar6 = pIVar7->YAxis[iVar14].Range.Min;
    local_58._0_4_ =
         (undefined4)
         ((((double)(float)(dVar9 / dVar3) * (dVar5 - dVar4) + dVar4) - (pIVar7->XAxis).Range.Min) *
          pIVar11->Mx + (double)pIVar11->PixelRange[iVar14].Min.x);
    local_58._4_4_ =
         (float)((((double)(float)(dVar10 / pIVar11->LogDenY[iVar14]) *
                   (pIVar7->YAxis[iVar14].Range.Max - dVar6) + dVar6) - dVar6) * pIVar11->My[iVar14]
                + (double)pIVar11->PixelRange[iVar14].Min.y);
    iVar14 = getter->Count;
    if (1 < iVar14) {
      iVar15 = 1;
      do {
        pIVar12 = GImPlot;
        lVar13 = (long)(((getter->Offset + iVar15) % iVar14 + iVar14) % iVar14) *
                 (long)getter->Stride;
        lVar8 = *(long *)((long)getter->Ys + lVar13);
        dVar9 = log10((double)*(long *)((long)getter->Xs + lVar13) /
                      (GImPlot->CurrentPlot->XAxis).Range.Min);
        dVar3 = pIVar12->LogDenX;
        pIVar7 = pIVar12->CurrentPlot;
        dVar4 = (pIVar7->XAxis).Range.Min;
        dVar5 = (pIVar7->XAxis).Range.Max;
        dVar10 = log10((double)lVar8 / pIVar7->YAxis[transformer->YAxis].Range.Min);
        iVar14 = transformer->YAxis;
        pIVar7 = pIVar12->CurrentPlot;
        dVar6 = pIVar7->YAxis[iVar14].Range.Min;
        local_68.x = (float)((((double)(float)(dVar9 / dVar3) * (dVar5 - dVar4) + dVar4) -
                             (pIVar7->XAxis).Range.Min) * pIVar12->Mx +
                            (double)pIVar12->PixelRange[iVar14].Min.x);
        fVar16 = (float)((((double)(float)(dVar10 / pIVar12->LogDenY[iVar14]) *
                           (pIVar7->YAxis[iVar14].Range.Max - dVar6) + dVar6) - dVar6) *
                         pIVar12->My[iVar14] + (double)pIVar12->PixelRange[iVar14].Min.y);
        local_68.y = fVar16;
        pIVar7 = pIVar11->CurrentPlot;
        fVar2 = (float)local_58._4_4_;
        if (fVar16 <= (float)local_58._4_4_) {
          fVar2 = fVar16;
        }
        if ((fVar2 < (pIVar7->PlotRect).Max.y) &&
           (fVar2 = (float)(~-(uint)(fVar16 <= (float)local_58._4_4_) & (uint)fVar16 |
                           local_58._4_4_ & -(uint)(fVar16 <= (float)local_58._4_4_)),
           pfVar1 = &(pIVar7->PlotRect).Min.y, *pfVar1 <= fVar2 && fVar2 != *pfVar1)) {
          fVar2 = (float)local_58._0_4_;
          if (local_68.x <= (float)local_58._0_4_) {
            fVar2 = local_68.x;
          }
          if ((fVar2 < (pIVar7->PlotRect).Max.x) &&
             (fVar2 = (float)(~-(uint)(local_68.x <= (float)local_58._0_4_) & (uint)local_68.x |
                             local_58._0_4_ & -(uint)(local_68.x <= (float)local_58._0_4_)),
             (pIVar7->PlotRect).Min.x <= fVar2 && fVar2 != (pIVar7->PlotRect).Min.x)) {
            ImDrawList::AddLine(local_60,(ImVec2 *)local_58,&local_68,col,line_weight);
          }
        }
        local_58._0_4_ = local_68.x;
        local_58._4_4_ = local_68.y;
        iVar15 = iVar15 + 1;
        iVar14 = getter->Count;
      } while (iVar15 < iVar14);
    }
  }
  return;
}

Assistant:

inline void RenderLineStrip(const Getter& getter, const Transformer& transformer, ImDrawList& DrawList, float line_weight, ImU32 col) {
    ImPlotContext& gp = *GImPlot;
    if (ImHasFlag(gp.CurrentPlot->Flags, ImPlotFlags_AntiAliased) || gp.Style.AntiAliasedLines) {
        ImVec2 p1 = transformer(getter(0));
        for (int i = 1; i < getter.Count; ++i) {
            ImVec2 p2 = transformer(getter(i));
            if (gp.CurrentPlot->PlotRect.Overlaps(ImRect(ImMin(p1, p2), ImMax(p1, p2))))
                DrawList.AddLine(p1, p2, col, line_weight);
            p1 = p2;
        }
    }
    else {
        RenderPrimitives(LineStripRenderer<Getter,Transformer>(getter, transformer, col, line_weight), DrawList, gp.CurrentPlot->PlotRect);
    }
}